

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O0

void __thiscall SimpleParallelAnalyzer::WorkerThread(SimpleParallelAnalyzer *this)

{
  bool bVar1;
  byte bVar2;
  U32 UVar3;
  int iVar4;
  pointer pSVar5;
  AnalyzerChannelData *pAVar6;
  size_type sVar7;
  reference pvVar8;
  uint64_t sample_number;
  pointer pSVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  U64 last_frame_sample_count;
  U64 estimated_frame_size;
  Frame frame;
  FrameV2 local_98 [8];
  FrameV2 frame_v2;
  U16 result;
  U64 sample;
  U64 UStack_78;
  bool is_first_frame;
  Frame last_frame;
  value_type local_4a;
  U32 num_data_lines;
  Channel local_30 [20];
  uint local_1c;
  uint local_18;
  U32 i;
  U32 count;
  MarkerType clock_arrow;
  SimpleParallelAnalyzer *this_local;
  
  _count = this;
  UVar3 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar3;
  pSVar5 = std::
           unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
           ::operator->(&this->mSettings);
  if (pSVar5->mClockEdge == NegEdge) {
    i = 5;
  }
  else {
    i = 4;
  }
  std::
  unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>::
  operator->(&this->mSettings);
  pAVar6 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mClock = pAVar6;
  std::vector<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>::clear(&this->mData);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->mDataMasks);
  std::vector<Channel,_std::allocator<Channel>_>::clear(&this->mDataChannels);
  pSVar5 = std::
           unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
           ::operator->(&this->mSettings);
  sVar7 = std::vector<Channel,_std::allocator<Channel>_>::size(&pSVar5->mDataChannels);
  local_18 = (uint)sVar7;
  for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
    pSVar5 = std::
             unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
             ::operator->(&this->mSettings);
    pvVar8 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                       (&pSVar5->mDataChannels,(ulong)local_1c);
    Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    bVar2 = Channel::operator!=(pvVar8,local_30);
    Channel::~Channel(local_30);
    if ((bVar2 & 1) != 0) {
      pSVar5 = std::
               unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
               ::operator->(&this->mSettings);
      std::vector<Channel,_std::allocator<Channel>_>::operator[]
                (&pSVar5->mDataChannels,(ulong)local_1c);
      _num_data_lines = (value_type)Analyzer::GetAnalyzerChannelData((Channel *)this);
      std::vector<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>::push_back
                (&this->mData,(value_type *)&num_data_lines);
      local_4a = (value_type)(1 << ((byte)local_1c & 0x1f));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&this->mDataMasks,&local_4a);
      pSVar5 = std::
               unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
               ::operator->(&this->mSettings);
      pvVar8 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                         (&pSVar5->mDataChannels,(ulong)local_1c);
      std::vector<Channel,_std::allocator<Channel>_>::push_back(&this->mDataChannels,pvVar8);
    }
  }
  std::vector<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>::size(&this->mData);
  pSVar5 = std::
           unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
           ::operator->(&this->mSettings);
  if (pSVar5->mClockEdge == NegEdge) {
    iVar4 = AnalyzerChannelData::GetBitState();
    if (iVar4 == 0) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
  }
  else {
    pSVar5 = std::
             unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
             ::operator->(&this->mSettings);
    if (pSVar5->mClockEdge == PosEdge) {
      iVar4 = AnalyzerChannelData::GetBitState();
      if (iVar4 == 1) {
        AnalyzerChannelData::AdvanceToNextEdge();
      }
    }
    else {
      pSVar5 = std::
               unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
               ::operator->(&this->mSettings);
      if (pSVar5->mClockEdge == DualEdge) {
        DecodeBothEdges(this);
        return;
      }
    }
  }
  AnalyzerChannelData::AdvanceToNextEdge();
  Frame::Frame((Frame *)&stack0xffffffffffffff88);
  bVar1 = true;
  do {
    sample_number = AnalyzerChannelData::GetSampleNumber();
    pSVar9 = std::
             unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
             ::operator->(&this->mResults);
    UVar3 = i;
    std::
    unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
    ::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)pSVar9,(MarkerType)sample_number,(Channel *)(ulong)UVar3);
    GetWordAtLocation(this,sample_number);
    FrameV2::FrameV2(local_98);
    FrameV2::AddInteger((char *)local_98,0x11a030);
    Frame::Frame((Frame *)&estimated_frame_size);
    estimated_frame_size = sample_number;
    bVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if ((bVar2 & 1) == 0) {
      last_frame_sample_count = 10;
      if (!bVar1) {
        lVar10 = (_last_frame - UStack_78) + 1;
        auVar13._8_4_ = (int)((ulong)lVar10 >> 0x20);
        auVar13._0_8_ = lVar10;
        auVar13._12_4_ = 0x45300000;
        dVar12 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) * 0.1;
        uVar11 = (ulong)dVar12;
        last_frame_sample_count =
             uVar11 | (long)(dVar12 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f;
        if (last_frame_sample_count < 3) {
          last_frame_sample_count = 3;
        }
      }
      bVar2 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mClock);
      if ((bVar2 & 1) == 0) {
        _frame = sample_number + last_frame_sample_count + -1;
        if (_frame <= (long)estimated_frame_size) {
          _frame = estimated_frame_size + 1;
        }
        pSVar9 = std::
                 unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                 ::operator->(&this->mResults);
        AnalyzerResults::AddFrame((Frame *)pSVar9);
        pSVar9 = std::
                 unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                 ::operator->(&this->mResults);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)pSVar9,(char *)local_98,0x11a030,estimated_frame_size);
        std::
        unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
        ::operator->(&this->mResults);
        AnalyzerResults::CommitResults();
        AnalyzerChannelData::AdvanceToNextEdge();
        AnalyzerChannelData::AdvanceToNextEdge();
      }
      else {
        AnalyzerChannelData::AdvanceToNextEdge();
        bVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
        if ((bVar2 & 1) == 0) {
          _frame = AnalyzerChannelData::GetSampleNumber();
          _frame = _frame + -1;
          pSVar9 = std::
                   unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ::operator->(&this->mResults);
          AnalyzerResults::AddFrame((Frame *)pSVar9);
          pSVar9 = std::
                   unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ::operator->(&this->mResults);
          AnalyzerResults::AddFrameV2
                    ((FrameV2 *)pSVar9,(char *)local_98,0x11a030,estimated_frame_size);
          std::
          unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
          ::operator->(&this->mResults);
          AnalyzerResults::CommitResults();
          AnalyzerChannelData::AdvanceToNextEdge();
        }
        else {
          AnalyzerChannelData::AdvanceToNextEdge();
          _frame = AnalyzerChannelData::GetSampleNumber();
          _frame = _frame + -1;
          pSVar9 = std::
                   unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ::operator->(&this->mResults);
          AnalyzerResults::AddFrame((Frame *)pSVar9);
          pSVar9 = std::
                   unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                   ::operator->(&this->mResults);
          AnalyzerResults::AddFrameV2
                    ((FrameV2 *)pSVar9,(char *)local_98,0x11a030,estimated_frame_size);
          std::
          unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
          ::operator->(&this->mResults);
          AnalyzerResults::CommitResults();
        }
      }
    }
    else {
      AnalyzerChannelData::AdvanceToNextEdge();
      bVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
      if ((bVar2 & 1) == 0) {
        _frame = AnalyzerChannelData::GetSampleNumber();
        _frame = _frame + -1;
        pSVar9 = std::
                 unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                 ::operator->(&this->mResults);
        AnalyzerResults::AddFrame((Frame *)pSVar9);
        pSVar9 = std::
                 unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                 ::operator->(&this->mResults);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)pSVar9,(char *)local_98,0x11a030,estimated_frame_size);
        std::
        unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
        ::operator->(&this->mResults);
        AnalyzerResults::CommitResults();
        AnalyzerChannelData::AdvanceToNextEdge();
      }
      else {
        AnalyzerChannelData::AdvanceToNextEdge();
        _frame = AnalyzerChannelData::GetSampleNumber();
        _frame = _frame + -1;
        pSVar9 = std::
                 unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                 ::operator->(&this->mResults);
        AnalyzerResults::AddFrame((Frame *)pSVar9);
        pSVar9 = std::
                 unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                 ::operator->(&this->mResults);
        AnalyzerResults::AddFrameV2
                  ((FrameV2 *)pSVar9,(char *)local_98,0x11a030,estimated_frame_size);
        std::
        unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
        ::operator->(&this->mResults);
        AnalyzerResults::CommitResults();
      }
    }
    bVar1 = false;
    UStack_78 = estimated_frame_size;
    _last_frame = _frame;
    Analyzer::ReportProgress((ulonglong)this);
    Frame::~Frame((Frame *)&estimated_frame_size);
    FrameV2::~FrameV2(local_98);
  } while( true );
}

Assistant:

void SimpleParallelAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();

    AnalyzerResults::MarkerType clock_arrow;
    if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::NegEdge )
        clock_arrow = AnalyzerResults::DownArrow;
    else
        clock_arrow = AnalyzerResults::UpArrow;


    mClock = GetAnalyzerChannelData( mSettings->mClockChannel );
    mData.clear();
    mDataMasks.clear();
    mDataChannels.clear();

    U32 count = mSettings->mDataChannels.size();
    for( U32 i = 0; i < count; i++ )
    {
        if( mSettings->mDataChannels[ i ] != UNDEFINED_CHANNEL )
        {
            mData.push_back( GetAnalyzerChannelData( mSettings->mDataChannels[ i ] ) );
            mDataMasks.push_back( 1 << i );
            mDataChannels.push_back( mSettings->mDataChannels[ i ] );
        }
    }


    U32 num_data_lines = mData.size();

    if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::NegEdge )
    {
        if( mClock->GetBitState() == BIT_LOW )
            mClock->AdvanceToNextEdge();
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::PosEdge )
    {
        if( mClock->GetBitState() == BIT_HIGH )
            mClock->AdvanceToNextEdge();
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::DualEdge )
    {
        // handling both edges is different enough to warrant a separate implementation.
        DecodeBothEdges();
        return;
    }

    mClock->AdvanceToNextEdge(); // this is the data-valid edge

    Frame last_frame;
    bool is_first_frame = true;
    for( ;; )
    {
        // We always start this loop on an active edge.

        U64 sample = mClock->GetSampleNumber();
        mResults->AddMarker( sample, clock_arrow, mSettings->mClockChannel );

        U16 result = GetWordAtLocation( sample );

        FrameV2 frame_v2;
        frame_v2.AddInteger( "data", result );

        Frame frame;
        frame.mData1 = result;
        frame.mFlags = 0;
        frame.mStartingSampleInclusive = sample;

        // The code in these if/else blocks could be replaced with 2 `AdvanceToNextEdge` calls, but if no more transitions are encountered,
        // the current state will never be output as a frame. These blocks will detect that case in the available data, and output a frame
        // immediately, and then another one once the next active edge sample is known.
        if( !mClock->DoMoreTransitionsExistInCurrentData() )
        {
            // There are no transitions available in the current data. Estimate what the frame size might be as 10 if we haven't seen any
            // frames yet, otherwise use 10% of the last frame size.
            U64 estimated_frame_size = 10;
            if( !is_first_frame )
            {
                U64 last_frame_sample_count = last_frame.mEndingSampleInclusive - last_frame.mStartingSampleInclusive + 1;
                estimated_frame_size = last_frame_sample_count * 0.1;
                if( estimated_frame_size < 3 )
                {
                    estimated_frame_size = 3;
                }
            }

            // Make sure we haven't gone past the end of the _real_ frame. WouldAdvancingCauseTransition can block, in which case more
            // transitions might show up.
            if( mClock->WouldAdvancingCauseTransition( estimated_frame_size ) )
            {
                // Move to inactive edge
                mClock->AdvanceToNextEdge();
                if( mClock->DoMoreTransitionsExistInCurrentData() )
                {
                    // Move to active edge
                    mClock->AdvanceToNextEdge();

                    frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                    mResults->AddFrame( frame );
                    mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                    mResults->CommitResults();
                }
                else
                {
                    frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                    mResults->AddFrame( frame );
                    mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                    mResults->CommitResults();

                    // Move to active edge
                    mClock->AdvanceToNextEdge();
                }
            }
            else
            {
                frame.mEndingSampleInclusive = sample + estimated_frame_size - 1;
                if( frame.mEndingSampleInclusive <= frame.mStartingSampleInclusive )
                {
                    frame.mEndingSampleInclusive = frame.mStartingSampleInclusive + 1;
                }
                mResults->AddFrame( frame );
                mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                mResults->CommitResults();

                // Move to inactive edge, and then the active edge
                mClock->AdvanceToNextEdge();
                mClock->AdvanceToNextEdge();
            }
        }
        else
        {
            // Move to inactive edge
            mClock->AdvanceToNextEdge();

            if( mClock->DoMoreTransitionsExistInCurrentData() )
            {
                // Move to active edge
                mClock->AdvanceToNextEdge();

                frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                mResults->AddFrame( frame );
                mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                mResults->CommitResults();
            }
            else
            {
                frame.mEndingSampleInclusive = mClock->GetSampleNumber() - 1;
                mResults->AddFrame( frame );
                mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
                mResults->CommitResults();

                // Move to active edge
                mClock->AdvanceToNextEdge();
            }
        }

        // Note: mClock should always be at an active edge at this point, and `frame` should have been added.

        is_first_frame = false;
        last_frame = frame;

        ReportProgress( frame.mEndingSampleInclusive );
    }
}